

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_getdate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  tm *ptVar2;
  jx9_value *pVal;
  char *pcVar3;
  time_t iValue;
  tm *pTm_1;
  time_t t_1;
  time_t t;
  tm *pTm;
  Sytm sTm;
  jx9_value *pArray;
  jx9_value *pValue;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    time(&t_1);
    t = (time_t)localtime(&t_1);
    sTm.tm_sec = ((tm *)t)->tm_hour;
    pTm._4_4_ = ((tm *)t)->tm_min;
    pTm._0_4_ = ((tm *)t)->tm_sec;
    sTm.tm_hour = ((tm *)t)->tm_mon;
    sTm.tm_min = ((tm *)t)->tm_mday;
    iVar1 = ((tm *)t)->tm_year;
    sTm.tm_year = ((tm *)t)->tm_yday;
    sTm.tm_mon = ((tm *)t)->tm_wday;
    sTm.tm_wday = ((tm *)t)->tm_isdst;
  }
  else {
    iVar1 = jx9_value_is_int(*apArg);
    if (iVar1 == 0) {
      time((time_t *)&pTm_1);
    }
    else {
      pTm_1 = (tm *)jx9_value_to_int64(*apArg);
      ptVar2 = localtime((time_t *)&pTm_1);
      if (ptVar2 == (tm *)0x0) {
        time((time_t *)&pTm_1);
      }
    }
    ptVar2 = localtime((time_t *)&pTm_1);
    sTm.tm_sec = ptVar2->tm_hour;
    pTm._4_4_ = ptVar2->tm_min;
    pTm._0_4_ = ptVar2->tm_sec;
    sTm.tm_hour = ptVar2->tm_mon;
    sTm.tm_min = ptVar2->tm_mday;
    iVar1 = ptVar2->tm_year;
    sTm.tm_year = ptVar2->tm_yday;
    sTm.tm_mon = ptVar2->tm_wday;
    sTm.tm_wday = ptVar2->tm_isdst;
  }
  sTm.tm_mday = iVar1 + 0x76c;
  sTm.tm_zone = (char *)0x0;
  sTm.tm_isdst = 0;
  sTm._36_4_ = 0;
  pVal = jx9_context_new_scalar(pCtx);
  if (pVal == (jx9_value *)0x0) {
    jx9_result_null(pCtx);
  }
  else {
    sTm.tm_gmtoff = (long)jx9_context_new_array(pCtx);
    if ((jx9_value *)sTm.tm_gmtoff == (jx9_value *)0x0) {
      jx9_result_null(pCtx);
    }
    else {
      jx9_value_int(pVal,(int)pTm);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"seconds",pVal);
      jx9_value_int(pVal,pTm._4_4_);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"minutes",pVal);
      jx9_value_int(pVal,sTm.tm_sec);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"hours",pVal);
      jx9_value_int(pVal,sTm.tm_min);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"mday",pVal);
      jx9_value_int(pVal,sTm.tm_mon);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"wday",pVal);
      jx9_value_int(pVal,sTm.tm_hour + 1);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"mon",pVal);
      jx9_value_int(pVal,sTm.tm_mday);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"year",pVal);
      jx9_value_int(pVal,sTm.tm_year);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"yday",pVal);
      pcVar3 = SyTimeGetDay(sTm.tm_mon);
      jx9_value_string(pVal,pcVar3,-1);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"weekday",pVal);
      jx9_value_reset_string_cursor(pVal);
      pcVar3 = SyTimeGetMonth(sTm.tm_hour);
      jx9_value_string(pVal,pcVar3,-1);
      jx9_array_add_strkey_elem((jx9_value *)sTm.tm_gmtoff,"month",pVal);
      iValue = time((time_t *)0x0);
      jx9_value_int64(pVal,iValue);
      jx9_array_add_elem((jx9_value *)sTm.tm_gmtoff,(jx9_value *)0x0,pVal);
      jx9_result_value(pCtx,(jx9_value *)sTm.tm_gmtoff);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_getdate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pArray;
	Sytm sTm;
	if( nArg < 1 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
#ifdef __WINNT__
#ifdef _MSC_VER
#if _MSC_VER >= 1400 /* Visual Studio 2005 and up */
#pragma warning(disable:4996) /* _CRT_SECURE...*/
#endif
#endif
#endif
		if( jx9_value_is_int(apArg[0]) ){
			t = (time_t)jx9_value_to_int64(apArg[0]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Fill the array */
	/* Seconds */
	jx9_value_int(pValue, sTm.tm_sec);
	jx9_array_add_strkey_elem(pArray, "seconds", pValue);
	/* Minutes */
	jx9_value_int(pValue, sTm.tm_min);
	jx9_array_add_strkey_elem(pArray, "minutes", pValue);
	/* Hours */
	jx9_value_int(pValue, sTm.tm_hour);
	jx9_array_add_strkey_elem(pArray, "hours", pValue);
	/* mday */
	jx9_value_int(pValue, sTm.tm_mday);
	jx9_array_add_strkey_elem(pArray, "mday", pValue);
	/* wday */
	jx9_value_int(pValue, sTm.tm_wday);
	jx9_array_add_strkey_elem(pArray, "wday", pValue);
	/* mon */
	jx9_value_int(pValue, sTm.tm_mon+1);
	jx9_array_add_strkey_elem(pArray, "mon", pValue);
	/* year */
	jx9_value_int(pValue, sTm.tm_year);
	jx9_array_add_strkey_elem(pArray, "year", pValue);
	/* yday */
	jx9_value_int(pValue, sTm.tm_yday);
	jx9_array_add_strkey_elem(pArray, "yday", pValue);
	/* Weekday */
	jx9_value_string(pValue, SyTimeGetDay(sTm.tm_wday), -1);
	jx9_array_add_strkey_elem(pArray, "weekday", pValue);
	/* Month */
	jx9_value_reset_string_cursor(pValue);
	jx9_value_string(pValue, SyTimeGetMonth(sTm.tm_mon), -1);
	jx9_array_add_strkey_elem(pArray, "month", pValue);
	/* Seconds since the epoch */
	jx9_value_int64(pValue, (jx9_int64)time(0));
	jx9_array_add_elem(pArray, 0 /* Index zero */, pValue);
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}